

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_36::HttpClientAdapter::request
          (Request *__return_storage_ptr__,HttpClientAdapter *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseArena *pPVar1;
  PromiseArenaMember *node;
  SourceLocation location;
  PromiseBase PVar2;
  WeakFulfiller<kj::HttpClient::Response> *pWVar3;
  Request *pRVar4;
  size_t sVar5;
  PromiseNode *pPVar6;
  StringPtr *pSVar7;
  ArrayDisposer *pAVar8;
  WeakFulfiller<kj::HttpClient::Response> *params;
  PromiseArena *pPVar9;
  void *pvVar10;
  int __flags;
  HttpHeaders *pHVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar13;
  void *__arg;
  OwnPromiseNode OVar14;
  Promise<void> promise;
  PromiseFulfillerPair<kj::HttpClient::Response> paf;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  String urlCopy;
  Refcounted *refcounted;
  OneWayPipe pipe;
  PromiseBase local_160;
  OwnPromiseNode local_158;
  OwnPromiseNode local_150;
  WeakFulfillerBase *local_148;
  WeakFulfiller<kj::HttpClient::Response> *local_140;
  undefined8 *local_138;
  long local_130;
  Request *local_128;
  PromiseArenaMember *in_stack_fffffffffffffee0;
  PromiseArenaMember *node_00;
  undefined8 *in_stack_fffffffffffffee8;
  long *in_stack_fffffffffffffef0;
  String local_108;
  SourceLocation local_e8;
  byte *local_d0;
  HttpClientAdapter *local_c8;
  PromiseNode *local_c0;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  HttpHeaders local_a0;
  Maybe<unsigned_long> local_40;
  char *pcVar11;
  
  pvVar13 = (void *)url.content.size_;
  pcVar11 = url.content.ptr;
  __arg = pvVar13;
  local_128 = __return_storage_ptr__;
  heapString(&local_108,(long)pvVar13 - 1);
  __flags = (int)pcVar11;
  pvVar10 = extraout_RDX;
  if ((long)pvVar13 - 1U != 0) {
    pHVar12 = (HttpHeaders *)local_108.content.size_;
    if ((HttpHeaders *)local_108.content.size_ != (HttpHeaders *)0x0) {
      pHVar12 = (HttpHeaders *)local_108.content.ptr;
    }
    memcpy(pHVar12,url.content.ptr,(long)pvVar13 - 1U);
    pvVar10 = extraout_RDX_00;
  }
  HttpHeaders::clone(&local_a0,(__fn *)headers,pvVar10,__flags,__arg);
  heap<kj::HttpHeaders>((kj *)&local_138,&local_a0);
  HttpHeaders::~HttpHeaders(&local_a0);
  local_40.ptr.isSet = (expectedBodySize->ptr).isSet;
  if (local_40.ptr.isSet == true) {
    local_40.ptr.field_1 = (expectedBodySize->ptr).field_1;
  }
  newOneWayPipe((OneWayPipe *)&local_a0,&local_40);
  params = (WeakFulfiller<kj::HttpClient::Response> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<kj::HttpClient::Response>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_00643d30;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00643d68;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::Response,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::Response>&>
            ((PromiseDisposer *)&local_e8,params);
  local_150.ptr = (PromiseNode *)local_e8.fileName;
  local_148 = &params->super_WeakFulfillerBase;
  local_140 = params;
  pPVar9 = (PromiseArena *)operator_new(0x30);
  pWVar3 = local_140;
  local_140 = (WeakFulfiller<kj::HttpClient::Response> *)0x0;
  local_d0 = pPVar9->bytes + 8;
  *(undefined ***)pPVar9->bytes = &PTR_send_006410e8;
  *(undefined ***)(pPVar9->bytes + 8) = &PTR_disposeImpl_00641118;
  *(HttpMethod *)(pPVar9->bytes + 0x14) = method;
  *(WeakFulfillerBase **)(pPVar9->bytes + 0x18) = &params->super_WeakFulfillerBase;
  *(WeakFulfiller<kj::HttpClient::Response> **)(pPVar9->bytes + 0x20) = pWVar3;
  pPVar9->bytes[0x28] = '\0';
  pPVar9->bytes[0x29] = '\0';
  pPVar9->bytes[0x2a] = '\0';
  pPVar9->bytes[0x2b] = '\0';
  pPVar9->bytes[0x2c] = '\0';
  pPVar9->bytes[0x2d] = '\0';
  pPVar9->bytes[0x2e] = '\0';
  pPVar9->bytes[0x2f] = '\0';
  pPVar9->bytes[0x10] = '\x01';
  pPVar9->bytes[0x11] = '\0';
  pPVar9->bytes[0x12] = '\0';
  pPVar9->bytes[0x13] = '\0';
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_b0 = "request";
  local_a8 = 0x1700001a3c;
  location.function = (char *)in_stack_fffffffffffffee8;
  location.fileName = (char *)in_stack_fffffffffffffee0;
  location._16_8_ = in_stack_fffffffffffffef0;
  local_c8 = this;
  newPromiseAndFulfiller<kj::Promise<void>>(location);
  node_00 = (PromiseArenaMember *)0x0;
  pPVar1 = in_stack_fffffffffffffee0->arena;
  local_158.ptr = (PromiseNode *)in_stack_fffffffffffffee0;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)in_stack_fffffffffffffee0 - (long)pPVar1) < 0x30) {
    pvVar10 = operator_new(0x400);
    OVar14.ptr = (PromiseNode *)((long)pvVar10 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar14.ptr,&local_158,
               kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar10 + 0x3d0) = &PTR_destroy_00641570;
    *(PromiseArena **)((long)pvVar10 + 0x3f8) = pPVar9;
    *(void **)((long)pvVar10 + 0x3d8) = pvVar10;
  }
  else {
    in_stack_fffffffffffffee0->arena = (PromiseArena *)0x0;
    OVar14.ptr = (PromiseNode *)(in_stack_fffffffffffffee0 + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar14.ptr,&local_158,
               kj::_::IdentityFunc<void>::operator());
    in_stack_fffffffffffffee0[-3]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00641570;
    in_stack_fffffffffffffee0[-1].arena = pPVar9;
    in_stack_fffffffffffffee0[-3].arena = pPVar1;
  }
  local_e8.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_e8.function = "setPromise";
  local_e8.lineNumber = 0x1ae2;
  local_e8.columnNumber = 0xe;
  local_160.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar14.ptr;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_c0,&local_160.node,&local_e8);
  pPVar6 = local_c0;
  PVar2.node.ptr = local_160.node.ptr;
  if (local_160.node.ptr != (PromiseNode *)0x0) {
    local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  node = *(PromiseArenaMember **)(pPVar9->bytes + 0x28);
  *(PromiseNode **)(pPVar9->bytes + 0x28) = pPVar6;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  OVar14.ptr = local_158.ptr;
  if (&(local_158.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_158.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar14.ptr)->super_PromiseArenaMember);
  }
  pHVar12 = (HttpHeaders *)local_108.content.ptr;
  if ((HttpHeaders *)local_108.content.size_ == (HttpHeaders *)0x0) {
    pHVar12 = (HttpHeaders *)0x4d2b65;
  }
  (**local_c8->service->_vptr_HttpService)
            (&local_e8,local_c8->service,(ulong)method,pHVar12,
             (char *)((long)(HttpHeaderTable **)local_108.content.size_ +
                     (ulong)((HttpHeaders *)local_108.content.size_ == (HttpHeaders *)0x0)),
             local_130,local_a0.indexedHeaders.ptr,pPVar9);
  Promise<void>::
  attach<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Promise<void> *)&local_160,(Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_e8,
             (String *)&local_a0,(Own<kj::HttpHeaders,_std::nullptr_t> *)&local_108);
  pcVar11 = local_e8.fileName;
  if ((PromiseArenaMember *)local_e8.fileName != (PromiseArenaMember *)0x0) {
    local_e8.fileName = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar11);
  }
  (**(code **)(*in_stack_fffffffffffffef0 + 0x10))(in_stack_fffffffffffffef0,&local_160);
  pRVar4 = local_128;
  (local_128->body).disposer = (Disposer *)local_a0.indexedHeaders.size_;
  (local_128->body).ptr = (AsyncOutputStream *)local_a0.indexedHeaders.disposer;
  local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
  local_e8.fileName = (char *)local_d0;
  local_e8.function = (char *)pPVar9;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>
            ((PromiseDisposer *)&local_c0,&local_150,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> *)
             &local_e8);
  pPVar6 = local_c0;
  pcVar11 = local_e8.function;
  local_c0 = (PromiseNode *)0x0;
  (pRVar4->response).super_PromiseBase.node.ptr = pPVar6;
  if ((PromiseArena *)local_e8.function != (PromiseArena *)0x0) {
    local_e8.function = (char *)0x0;
    (*(code *)**(undefined8 **)local_e8.fileName)
              (local_e8.fileName,(byte *)pcVar11 + *(long *)(*(long *)(byte *)pcVar11 + -0x10));
  }
  PVar2.node.ptr = local_160.node.ptr;
  if (local_160.node.ptr != (PromiseNode *)0x0) {
    local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  if (in_stack_fffffffffffffef0 != (long *)0x0) {
    (**(code **)*in_stack_fffffffffffffee8)
              (in_stack_fffffffffffffee8,
               (long)in_stack_fffffffffffffef0 + *(long *)(*in_stack_fffffffffffffef0 + -0x10));
  }
  if (node_00 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node_00);
  }
  pWVar3 = local_140;
  if (local_140 != (WeakFulfiller<kj::HttpClient::Response> *)0x0) {
    local_140 = (WeakFulfiller<kj::HttpClient::Response> *)0x0;
    (**(local_148->super_Disposer)._vptr_Disposer)
              (local_148,(long)pWVar3 + *(long *)(*(long *)pWVar3 + -0x10));
  }
  OVar14.ptr = local_150.ptr;
  if (&(local_150.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_150.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar14.ptr)->super_PromiseArenaMember);
  }
  pAVar8 = local_a0.indexedHeaders.disposer;
  if (local_a0.indexedHeaders.disposer != (ArrayDisposer *)0x0) {
    local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
    (***(_func_int ***)local_a0.indexedHeaders.size_)
              (local_a0.indexedHeaders.size_,
               pAVar8->_vptr_ArrayDisposer[-2] + (long)&pAVar8->_vptr_ArrayDisposer);
  }
  pSVar7 = local_a0.indexedHeaders.ptr;
  if (local_a0.indexedHeaders.ptr != (StringPtr *)0x0) {
    local_a0.indexedHeaders.ptr = (StringPtr *)0x0;
    (*(code *)((((local_a0.table)->namesById).builder.ptr)->content).ptr)
              (local_a0.table,
               (long)&(pSVar7->content).ptr + *(long *)((pSVar7->content).ptr + -0x10));
  }
  if (local_130 != 0) {
    local_130 = 0;
    (**(code **)*local_138)();
  }
  sVar5 = local_108.content.size_;
  pcVar11 = local_108.content.ptr;
  if ((HttpHeaders *)local_108.content.ptr != (HttpHeaders *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(local_108.content.disposer)->_vptr_ArrayDisposer)
              (local_108.content.disposer,pcVar11,1,sVar5,sVar5,0);
  }
  return local_128;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());

    auto pipe = newOneWayPipe(expectedBodySize);

    // TODO(cleanup): The ownership relationships here are a mess. Can we do something better
    //   involving a PromiseAdapter, maybe?
    auto paf = kj::newPromiseAndFulfiller<Response>();
    auto responder = kj::refcounted<ResponseImpl>(method, kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto promise = service.request(method, urlCopy, *headersCopy, *pipe.in, *responder)
        .attach(kj::mv(pipe.in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return {
      kj::mv(pipe.out),
      paf.promise.attach(kj::mv(responder))
    };
  }